

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Downloader.cpp
# Opt level: O3

void __thiscall Downloader::saveFile(Downloader *this,qint64 received,qint64 total)

{
  char cVar1;
  QUrl url;
  QString t;
  QFile file;
  QUrl local_60;
  QArrayData *local_58 [4];
  QArrayData *local_38;
  char16_t *local_30;
  qsizetype local_28;
  QFile local_20 [16];
  
  QNetworkReply::attribute((Attribute)local_58);
  QVariant::toUrl();
  QVariant::~QVariant((QVariant *)local_58);
  cVar1 = QUrl::isEmpty();
  if (cVar1 == '\0') {
    startDownload(this,&local_60);
  }
  else {
    local_38 = &((this->m_fileName).d.d)->super_QArrayData;
    local_30 = (this->m_fileName).d.ptr;
    local_28 = (this->m_fileName).d.size;
    if (local_38 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_38->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_38->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append((QString *)&local_38);
    QDir::filePath((QString *)local_58);
    QFile::QFile(local_20,(QString *)local_58);
    if (local_58[0] != (QArrayData *)0x0) {
      LOCK();
      (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58[0],2,8);
      }
    }
    if (local_38 != (QArrayData *)0x0) {
      LOCK();
      (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38,2,8);
      }
    }
    cVar1 = QFile::open(local_20,6);
    if (cVar1 != '\0') {
      QIODevice::readAll();
      QIODevice::write((QByteArray *)local_20);
      if (local_58[0] != (QArrayData *)0x0) {
        LOCK();
        (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58[0],1,8);
        }
      }
      QFileDevice::close();
    }
    QFile::~QFile(local_20);
  }
  QUrl::~QUrl(&local_60);
  return;
}

Assistant:

void Downloader::saveFile(qint64 received, qint64 total)
{
   Q_UNUSED(received);
   Q_UNUSED(total);

   /* Check if we need to redirect */
   QUrl url = m_reply->attribute(QNetworkRequest::RedirectionTargetAttribute).toUrl();
   if (!url.isEmpty())
   {
      startDownload(url);
      return;
   }

   /* Save downloaded data to disk */
   QFile file(m_downloadDir.filePath(m_fileName + PARTIAL_DOWN));
   if (file.open(QIODevice::WriteOnly | QIODevice::Append))
   {
      file.write(m_reply->readAll());
      file.close();
   }
}